

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeNF
          (ChElementBeamANCF_3333 *this,double xi,double eta,double zeta,ChVectorDynamic<> *Qi,
          double *detJ,ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Index index;
  void *pvVar15;
  ulong uVar16;
  long lVar17;
  undefined8 *puVar18;
  double *pdVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ChMatrix33<double> J_Cxi;
  VectorN G_C;
  VectorN G_B;
  VectorN G_A;
  ChMatrix33<double> J_Cxi_Inv;
  MatrixNx3 QiCompact;
  VectorN Sxi_compact;
  MatrixNx3c Sxi_D;
  Matrix3xN e_bar;
  undefined1 local_480 [24];
  double local_468;
  double local_460;
  double dStack_458;
  double local_450;
  double local_448;
  double dStack_440;
  double local_438 [4];
  double local_418;
  double dStack_410;
  double local_408;
  double dStack_400;
  double local_3f8;
  assign_op<double,_double> local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined8 local_3a8;
  SrcXprType local_398;
  double dStack_390;
  double local_388;
  double dStack_380;
  double local_378;
  double dStack_370;
  double local_368;
  double dStack_360;
  undefined8 local_358;
  Matrix<double,_3,_3,_1,_3,_3> local_350;
  Matrix<double,_9,_3,_1,_9,_3> local_308;
  VectorN local_230;
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  double local_1a8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  double local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  double local_118;
  Matrix3xN local_108;
  
  Calc_Sxi_compact(this,&local_230,xi,eta,zeta);
  dVar4 = (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows;
  if (2 < (long)dVar4) {
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[1]
         = (double)(F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[2]
         = 1.48219693752374e-323;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[5]
         = 0.0;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[0]
         = (double)&local_230;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[4]
         = (double)F;
    local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>.m_storage.m_data.array[7]
         = dVar4;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,9,3,1,9,3>,Eigen::Product<Eigen::Matrix<double,9,1,0,9,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>,0>,Eigen::internal::assign_op<double,double>>
              (&local_308,
               (Product<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_0>
                *)&local_108,(assign_op<double,_double> *)local_1e8,(type)0x0);
    pdVar19 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
        0x1b) {
      if (pdVar19 != (double *)0x0) {
        free((void *)pdVar19[-1]);
      }
      pvVar15 = malloc(0x118);
      if (pvVar15 == (void *)0x0) {
        puVar18 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar18 = std::ostream::_M_insert<bool>;
        __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      *(void **)(((ulong)pvVar15 & 0xffffffffffffffc0) + 0x38) = pvVar15;
      pdVar19 = (double *)(((ulong)pvVar15 & 0xffffffffffffffc0) + 0x40);
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           pdVar19;
      (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x1b;
    }
    uVar16 = 0xfffffffffffffff8;
    do {
      dVar4 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar16 + 9];
      dVar1 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar16 + 10];
      dVar2 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar16 + 0xb];
      dVar9 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
              m_data.array[uVar16 + 0xc];
      dVar10 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
               m_data.array[uVar16 + 0xd];
      dVar11 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
               m_data.array[uVar16 + 0xe];
      dVar12 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
               m_data.array[uVar16 + 0xf];
      pdVar5 = pdVar19 + uVar16 + 8;
      *pdVar5 = local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.
                m_data.array[uVar16 + 8];
      pdVar5[1] = dVar4;
      pdVar5[2] = dVar1;
      pdVar5[3] = dVar2;
      pdVar5[4] = dVar9;
      pdVar5[5] = dVar10;
      pdVar5[6] = dVar11;
      pdVar5[7] = dVar12;
      uVar16 = uVar16 + 8;
    } while (uVar16 < 0x10);
    lVar17 = 0x18;
    do {
      pdVar19[lVar17] =
           local_308.super_PlainObjectBase<Eigen::Matrix<double,_9,_3,_1,_9,_3>_>.m_storage.m_data.
           array[lVar17];
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x1b);
    CalcCoordMatrix(this,&local_108);
    Calc_Sxi_D(this,(MatrixNx3c *)local_1e8,xi,eta,zeta);
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::evalTo<Eigen::Matrix<double,3,3,1,3,3>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)local_480,&local_108,(MatrixNx3c *)local_1e8);
    local_398.m_xpr = (Matrix<double,_3,_3,_1,_3,_3> *)local_480;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_350,&local_398,local_3e8);
    auVar39._8_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar39._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar26._8_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar26._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar21._8_8_ = 0;
    auVar21._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar21 = vmovddup_avx512vl(auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar22 = vmovddup_avx512vl(auVar22);
    auVar23 = vmulpd_avx512vl(auVar21,local_148);
    auVar24 = vmulpd_avx512vl(auVar26,local_180);
    auVar25 = vmulpd_avx512vl(auVar21,local_138);
    auVar26 = vmulpd_avx512vl(auVar26,local_170);
    auVar27 = vmulpd_avx512vl(auVar21,local_128);
    auVar28 = vmulpd_avx512vl(local_1a0,auVar22);
    auVar29 = vmulpd_avx512vl(auVar21,local_158);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = local_118;
    auVar21 = vmulsd_avx512f(auVar21,auVar41);
    local_398.m_xpr =
         (XprTypeNested)
         (local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[0] * local_1e8._0_8_ +
          local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
          array[3] * local_1a0._0_8_ + auVar29._0_8_);
    dStack_390 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[0] * local_1e8._8_8_ +
                 local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[3] * local_1a0._8_8_ + auVar29._8_8_;
    local_388 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[3] * local_190._0_8_ +
                local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[0] * local_1e8._16_8_ + auVar23._0_8_;
    dStack_380 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[3] * local_190._8_8_ +
                 local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[0] * local_1e8._24_8_ + auVar23._8_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = local_1a8;
    auVar23 = vmulsd_avx512f(auVar39,auVar43);
    local_378 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[0] * local_1c8._0_8_ + auVar24._0_8_ + auVar25._0_8_;
    dStack_370 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[0] * local_1c8._8_8_ + auVar24._8_8_ + auVar25._8_8_;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_160;
    local_368 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[0] * local_1b8._0_8_ + auVar26._0_8_ + auVar27._0_8_;
    dStack_360 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[0] * local_1b8._8_8_ + auVar26._8_8_ + auVar27._8_8_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         auVar23._0_8_ +
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[3] * local_160;
    auVar21 = vaddsd_avx512f(auVar27,auVar21);
    local_358 = auVar21._0_8_;
    auVar40._8_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar40._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar21 = vmulpd_avx512vl(local_1e8._0_16_,auVar40);
    auVar21 = vaddpd_avx512vl(auVar21,auVar28);
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar23 = vmovddup_avx512vl(auVar23);
    auVar24 = vmulpd_avx512vl(local_158,auVar23);
    auVar25 = vmulpd_avx512vl(local_128,auVar23);
    auVar21 = vaddpd_avx512vl(auVar21,auVar24);
    auVar24 = vmulpd_avx512vl(local_190,auVar22);
    local_3e8[0] = (assign_op<double,_double>)auVar21[0];
    local_3e8[1] = (assign_op<double,_double>)auVar21[1];
    local_3e8[2] = (assign_op<double,_double>)auVar21[2];
    local_3e8[3] = (assign_op<double,_double>)auVar21[3];
    local_3e8[4] = (assign_op<double,_double>)auVar21[4];
    local_3e8[5] = (assign_op<double,_double>)auVar21[5];
    local_3e8[6] = (assign_op<double,_double>)auVar21[6];
    local_3e8[7] = (assign_op<double,_double>)auVar21[7];
    local_3e8[8] = (assign_op<double,_double>)auVar21[8];
    local_3e8[9] = (assign_op<double,_double>)auVar21[9];
    local_3e8[10] = (assign_op<double,_double>)auVar21[10];
    local_3e8[0xb] = (assign_op<double,_double>)auVar21[0xb];
    local_3e8[0xc] = (assign_op<double,_double>)auVar21[0xc];
    local_3e8[0xd] = (assign_op<double,_double>)auVar21[0xd];
    local_3e8[0xe] = (assign_op<double,_double>)auVar21[0xe];
    local_3e8[0xf] = (assign_op<double,_double>)auVar21[0xf];
    auVar21 = vmulpd_avx512vl(local_1e8._16_16_,auVar40);
    auVar21 = vaddpd_avx512vl(auVar21,auVar24);
    auVar24 = vmulpd_avx512vl(local_148,auVar23);
    local_3d8 = vaddpd_avx512vl(auVar21,auVar24);
    auVar21 = vmulpd_avx512vl(local_180,auVar22);
    auVar24 = vmulpd_avx512vl(local_1c8,auVar40);
    auVar21 = vaddpd_avx512vl(auVar24,auVar21);
    auVar24 = vmulpd_avx512vl(local_138,auVar23);
    local_3c8 = vaddpd_avx512vl(auVar21,auVar24);
    auVar21 = vmulpd_avx512vl(local_170,auVar22);
    auVar24 = vmulpd_avx512vl(local_1b8,auVar40);
    auVar26 = vmulsd_avx512f(auVar43,auVar40);
    auVar21 = vaddpd_avx512vl(auVar24,auVar21);
    local_3b8 = vaddpd_avx512vl(auVar21,auVar25);
    auVar21 = vmulsd_avx512f(auVar29,auVar22);
    auVar21 = vaddsd_avx512f(auVar26,auVar21);
    auVar22 = vmulsd_avx512f(auVar41,auVar23);
    auVar21 = vaddsd_avx512f(auVar21,auVar22);
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar22 = vmovddup_avx512vl(auVar24);
    local_3a8 = auVar21._0_8_;
    auVar28._8_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar28._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar21 = vmulpd_avx512vl(local_1a0,auVar22);
    auVar23 = vmulpd_avx512vl(local_190,auVar22);
    auVar25._8_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar25._0_8_ =
         local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar24 = vmulpd_avx512vl(local_148,auVar25);
    local_438[0] = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2] * local_1e8._0_8_ + auVar21._0_8_ +
                   local_158._0_8_ *
                   local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    local_438[1] = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2] * local_1e8._8_8_ + auVar21._8_8_ +
                   local_158._8_8_ *
                   local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
    local_438[2] = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2] * local_1e8._16_8_ + auVar23._0_8_ + auVar24._0_8_;
    local_438[3] = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2] * local_1e8._24_8_ + auVar23._8_8_ + auVar24._8_8_;
    auVar21 = vmulpd_avx512vl(local_180,auVar22);
    auVar23 = vmulpd_avx512vl(local_138,auVar25);
    auVar42._8_8_ = 0;
    auVar42._0_8_ = local_118;
    auVar24 = vmulsd_avx512f(auVar42,auVar25);
    local_418 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[2] * local_1c8._0_8_ + auVar21._0_8_ + auVar23._0_8_;
    dStack_410 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[2] * local_1c8._8_8_ + auVar21._8_8_ + auVar23._8_8_;
    auVar21 = vmulpd_avx512vl(local_170,auVar22);
    auVar23 = vmulpd_avx512vl(local_128,auVar25);
    auVar22 = vmulsd_avx512f(auVar29,auVar22);
    local_408 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                m_data.array[2] * local_1b8._0_8_ + auVar21._0_8_ + auVar23._0_8_;
    dStack_400 = local_350.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[2] * local_1b8._8_8_ + auVar21._8_8_ + auVar23._8_8_;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_1a8;
    auVar21 = vmulsd_avx512f(auVar44,auVar28);
    local_3f8 = auVar21._0_8_ + auVar22._0_8_ + auVar24._0_8_;
    if (5 < (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar19 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar16 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      ;
      uVar20 = 2;
      lVar17 = 0;
      pdVar5 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      auVar6._8_8_ = 0x3fe0000000000000;
      auVar6._0_8_ = 0x3fe0000000000000;
      auVar22 = vmulpd_avx512vl(*(undefined1 (*) [16])(pdVar19 + 3),auVar6);
      dVar4 = pdVar19[5] * 0.5;
      auVar21 = vshufpd_avx(auVar22,auVar22,1);
      while ((long)(uVar20 - 2) < (long)uVar16) {
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(double *)(local_3e8 + lVar17);
        dVar1 = *(double *)((long)local_438 + lVar17);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = dVar1;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(double *)(local_3e8 + lVar17) * -dVar4;
        auVar23 = vfmadd231sd_fma(auVar37,auVar21,auVar34);
        pdVar5[uVar20 - 2] = auVar23._0_8_ + pdVar5[uVar20 - 2];
        if (uVar16 <= uVar20 - 1) break;
        dVar2 = *(double *)((long)&local_398.m_xpr + lVar17);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar2;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar4;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = dVar1 * -auVar22._0_8_;
        auVar23 = vfmadd231sd_fma(auVar35,auVar30,auVar38);
        pdVar5[uVar20 - 1] = auVar23._0_8_ + pdVar5[uVar20 - 1];
        if (uVar16 <= uVar20) break;
        lVar17 = lVar17 + 8;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = dVar2 * -auVar21._0_8_;
        auVar23 = vfmadd213sd_fma(auVar33,auVar22,auVar36);
        pdVar5[uVar20] = auVar23._0_8_ + pdVar5[uVar20];
        uVar20 = uVar20 + 3;
        if (uVar20 == 0x1d) {
          auVar13._8_8_ = dStack_458;
          auVar13._0_8_ = local_460;
          auVar14._8_8_ = dStack_440;
          auVar14._0_8_ = local_448;
          auVar7._8_8_ = local_450;
          auVar7._0_8_ = local_450;
          auVar21 = vmulpd_avx512vl(auVar13,auVar7);
          auVar8._8_8_ = local_468;
          auVar8._0_8_ = local_468;
          auVar23 = vfmsub231pd_avx512vl(auVar21,auVar14,auVar8);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = dStack_440;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = local_448 * dStack_458;
          auVar22 = vfmsub132sd_fma(auVar13,auVar32,auVar3);
          auVar21 = vpermilpd_avx(local_480._8_16_,1);
          auVar31._0_8_ = auVar21._0_8_ * auVar23._0_8_;
          auVar31._8_8_ = auVar21._8_8_ * auVar23._8_8_;
          auVar21 = vshufpd_avx(auVar31,auVar31,1);
          *detJ = auVar31._0_8_ + (auVar22._0_8_ * (double)local_480._0_8_ - auVar21._0_8_);
          return;
        }
      }
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChElementBeamANCF_3333::ComputeNF(
    const double xi,             // parametric coordinate in volume
    const double eta,            // parametric coordinate in volume
    const double zeta,           // parametric coordinate in volume
    ChVectorDynamic<>& Qi,       // Return result of N'*F  here, maybe with offset block_offset
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is = n.field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
) {
    // Compute the generalized force vector for the applied force component using the compact form of the shape
    // functions.  This requires a reshaping of the calculated matrix to get it into the correct vector order (just a
    // reinterpretation of the data since the matrix is in row-major format)
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, eta, zeta);
    MatrixNx3 QiCompact;

    QiCompact = Sxi_compact * F.segment(0, 3).transpose();

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Qi = QiReshaped;

    // Compute the generalized force vector for the applied moment component
    // See: Antonio M Recuero, Javier F Aceituno, Jose L Escalona, and Ahmed A Shabana.
    // A nonlinear approach for modeling rail flexibility using the absolute nodal coordinate
    // formulation. Nonlinear Dynamics, 83(1-2):463-481, 2016.

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    MatrixNx3c Sxi_D;
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_Cxi;
    ChMatrix33<double> J_Cxi_Inv;

    J_Cxi.noalias() = e_bar * Sxi_D;
    J_Cxi_Inv = J_Cxi.inverse();

    // Compute the unique pieces that make up the moment projection matrix "G"
    VectorN G_A = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 0) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 0) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 0);
    VectorN G_B = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 1) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 1) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 1);
    VectorN G_C = Sxi_D.col(0).transpose() * J_Cxi_Inv(0, 2) + Sxi_D.col(1).transpose() * J_Cxi_Inv(1, 2) +
                  Sxi_D.col(2).transpose() * J_Cxi_Inv(2, 2);

    ChVectorN<double, 3> M_scaled = 0.5 * F.segment(3, 3);

    // Compute G'M without actually forming the complete matrix "G" (since it has a sparsity pattern to it)
    for (unsigned int i = 0; i < NSF; i++) {
        Qi(3 * i) += M_scaled(1) * G_C(i) - M_scaled(2) * G_B(i);
        Qi((3 * i) + 1) += M_scaled(2) * G_A(i) - M_scaled(0) * G_C(i);
        Qi((3 * i) + 2) += M_scaled(0) * G_B(i) - M_scaled(1) * G_A(i);
    }

    // Compute the element Jacobian between the current configuration and the normalized configuration
    // This is different than the element Jacobian between the reference configuration and the normalized
    //  configuration used in the internal force calculations.  For this calculation, this is the ratio between the
    //  actual differential volume and the normalized differential volume.  The determinate of the element Jacobian is
    //  used to calculate this volume ratio for potential use in Gauss-Quadrature or similar numeric integration.
    detJ = J_Cxi.determinant();
}